

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_impl_avx2.c
# Opt level: O2

uint sad32x32(uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  int iVar3;
  bool bVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  undefined1 auVar7 [32];
  
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  iVar3 = 0x10;
  while( true ) {
    bVar4 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    auVar5 = auVar6._0_32_;
    if (bVar4) break;
    auVar7 = vpsadbw_avx2(*(undefined1 (*) [32])ref_ptr,*(undefined1 (*) [32])src_ptr);
    auVar2 = vpsadbw_avx2(*(undefined1 (*) [32])(*(undefined1 (*) [32])ref_ptr + ref_stride),
                          *(undefined1 (*) [32])(*(undefined1 (*) [32])src_ptr + src_stride));
    auVar5 = vpaddd_avx2(auVar7,auVar5);
    auVar5 = vpaddd_avx2(auVar5,auVar2);
    auVar6 = ZEXT3264(auVar5);
    ref_ptr = *(undefined1 (*) [32])ref_ptr + ref_stride * 2;
    src_ptr = *(undefined1 (*) [32])src_ptr + src_stride * 2;
  }
  auVar7 = vpsrldq_avx2(auVar5,8);
  auVar5 = vpaddd_avx2(auVar7,auVar5);
  auVar1 = vpaddd_avx(auVar5._16_16_,auVar5._0_16_);
  return auVar1._0_4_;
}

Assistant:

static unsigned int sad32x32(const uint8_t *src_ptr, int src_stride,
                             const uint8_t *ref_ptr, int ref_stride) {
  __m256i s1, s2, r1, r2;
  __m256i sum = _mm256_setzero_si256();
  __m128i sum_i128;
  int i;

  for (i = 0; i < 16; ++i) {
    r1 = _mm256_loadu_si256((__m256i const *)ref_ptr);
    r2 = _mm256_loadu_si256((__m256i const *)(ref_ptr + ref_stride));
    s1 = _mm256_sad_epu8(r1, _mm256_loadu_si256((__m256i const *)src_ptr));
    s2 = _mm256_sad_epu8(
        r2, _mm256_loadu_si256((__m256i const *)(src_ptr + src_stride)));
    sum = _mm256_add_epi32(sum, _mm256_add_epi32(s1, s2));
    ref_ptr += ref_stride << 1;
    src_ptr += src_stride << 1;
  }

  sum = _mm256_add_epi32(sum, _mm256_srli_si256(sum, 8));
  sum_i128 = _mm_add_epi32(_mm256_extracti128_si256(sum, 1),
                           _mm256_castsi256_si128(sum));
  return (unsigned int)_mm_cvtsi128_si32(sum_i128);
}